

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

void __thiscall QWizardPrivate::cleanupPagesNotInHistory(QWizardPrivate *this)

{
  long lVar1;
  long *plVar2;
  QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>
  *pQVar3;
  _Base_ptr p_Var4;
  long lVar5;
  long lVar6;
  _Rb_tree_node_base *p_Var7;
  long in_RCX;
  long lVar8;
  
  plVar2 = *(long **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  QMap<int,_QWizardPage_*>::detach(&this->pageMap);
  p_Var7 = *(_Base_ptr *)
            ((long)&(((this->pageMap).d.d.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header +
            0x10);
  QMap<int,_QWizardPage_*>::detach(&this->pageMap);
  pQVar3 = (this->pageMap).d.d.ptr;
  do {
    if ((_Rb_tree_header *)p_Var7 == &(pQVar3->m)._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
    p_Var4 = (p_Var7[1]._M_parent)->_M_parent;
    if (*(char *)((long)&p_Var4[0x18]._M_parent + 6) == '\x01') {
      lVar5 = (this->history).d.size;
      if (lVar5 == 0) {
LAB_00513c7f:
        in_RCX = -1;
      }
      else {
        lVar8 = -4;
        do {
          lVar1 = lVar5 * -4 + lVar8;
          if (lVar1 == -4) goto LAB_00513c79;
          in_RCX = lVar8 + 4;
          lVar6 = lVar8 + 4;
          lVar8 = in_RCX;
        } while (*(_Rb_tree_color *)((long)(this->history).d.ptr + lVar6) != p_Var7[1]._M_color);
        in_RCX = in_RCX >> 2;
LAB_00513c79:
        if (lVar1 == -4) goto LAB_00513c7f;
      }
      if (in_RCX == -1) {
        (**(code **)(*plVar2 + 0x1e0))(plVar2);
        *(undefined1 *)((long)&p_Var4[0x18]._M_parent + 6) = 0;
      }
    }
    p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
  } while( true );
}

Assistant:

void QWizardPrivate::cleanupPagesNotInHistory()
{
    Q_Q(QWizard);

    for (auto it = pageMap.begin(), end = pageMap.end(); it != end; ++it) {
        const auto idx = it.key();
        const auto page = it.value()->d_func();
        if (page->initialized && !history.contains(idx)) {
            q->cleanupPage(idx);
            page->initialized = false;
        }
    }
}